

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_buffers.cpp
# Opt level: O3

vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>_>_>
* __thiscall
polyscope::render::getAttributeBufferDataRange<std::array<glm::vec<3,float,(glm::qualifier)0>,3ul>>
          (vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>_>_>
           *__return_storage_ptr__,render *this,AttributeBuffer *buff,size_t ind,size_t count)

{
  pointer paVar1;
  long lVar2;
  size_t sVar3;
  long lVar4;
  long lVar5;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  fetch;
  allocator_type local_29;
  void *local_28 [3];
  
  (**(code **)(*(long *)this + 0xe8))(local_28,this,(long)buff * 3);
  std::
  vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>_>_>
  ::vector(__return_storage_ptr__,ind,&local_29);
  if (ind != 0) {
    lVar2 = 0;
    sVar3 = 0;
    do {
      lVar4 = 3;
      lVar5 = lVar2;
      do {
        paVar1 = (__return_storage_ptr__->
                 super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        *(undefined4 *)((long)&paVar1->_M_elems[0].field_2 + lVar5) =
             *(undefined4 *)((long)local_28[0] + lVar5 + 8);
        *(undefined8 *)((long)&paVar1->_M_elems[0].field_0 + lVar5) =
             *(undefined8 *)((long)local_28[0] + lVar5);
        lVar5 = lVar5 + 0xc;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
      sVar3 = sVar3 + 1;
      lVar2 = lVar2 + 0x24;
    } while (sVar3 != ind);
  }
  if (local_28[0] != (void *)0x0) {
    operator_delete(local_28[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::array<glm::vec3, 3>> getAttributeBufferDataRange<std::array<glm::vec3, 3>>(AttributeBuffer& buff,
                                                                                            size_t ind, size_t count) {
  std::vector<glm::vec3> fetch = buff.getDataRange_vec3(3 * ind, 3 * count);
  std::vector<std::array<glm::vec3, 3>> out(count);
  for (size_t i = 0; i < count; i++) {
    for (size_t j = 0; j < 3; j++) {
      out[i][j] = fetch[3 * i + j];
    }
  }
  return out;
}